

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdesktopunixservices.cpp
# Opt level: O3

bool detectWebBrowser(QByteArray *desktop,bool checkBrowserVariable,QString *browser)

{
  char *pcVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  undefined1 *puVar4;
  long lVar5;
  Data *pDVar6;
  qsizetype qVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  storage_type *psVar11;
  long in_FS_OFFSET;
  bool bVar12;
  bool bVar13;
  QLatin1String QVar14;
  QByteArrayView QVar15;
  char *browsers [4];
  QArrayData *local_b8;
  char16_t *pcStack_b0;
  undefined1 *local_a8;
  QArrayDataPointer<QString> local_98;
  QByteArray local_78;
  char *local_58 [4];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58[0] = "google-chrome";
  local_58[1] = "firefox";
  local_58[2] = "mozilla";
  local_58[3] = "opera";
  if ((browser->d).ptr != (char16_t *)0x0) {
    pQVar2 = &((browser->d).d)->super_QArrayData;
    (browser->d).d = (Data *)0x0;
    (browser->d).ptr = (char16_t *)0x0;
    (browser->d).size = 0;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
  }
  local_b8 = (QArrayData *)0x0;
  pcStack_b0 = L"xdg-open";
  local_a8 = (undefined1 *)0x8;
  local_98.size = 0;
  local_98.d = (Data *)0x0;
  local_98.ptr = (QString *)0x0;
  QStandardPaths::findExecutable((QString *)&local_78,(QList_conflict *)&local_b8);
  pQVar2 = &((browser->d).d)->super_QArrayData;
  pcVar3 = (browser->d).ptr;
  (browser->d).d = (Data *)local_78.d.d;
  (browser->d).ptr = (char16_t *)local_78.d.ptr;
  puVar4 = (undefined1 *)(browser->d).size;
  (browser->d).size = local_78.d.size;
  local_78.d.d = (Data *)pQVar2;
  local_78.d.ptr = (char *)pcVar3;
  local_78.d.size = (qsizetype)puVar4;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
  lVar5 = (browser->d).size;
  if (local_b8 != (QArrayData *)0x0) {
    LOCK();
    (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_b8,2,0x10);
    }
  }
  bVar12 = true;
  if (lVar5 != 0) goto LAB_0062456a;
  if (checkBrowserVariable) {
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    local_b8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pcStack_b0 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    qEnvironmentVariable((char *)&local_b8);
    if (local_a8 == (undefined1 *)0x0) {
      qEnvironmentVariable((char *)&local_78);
      qVar7 = local_78.d.size;
      pDVar6 = local_78.d.d;
      pcVar3 = pcStack_b0;
      pQVar2 = local_b8;
      local_78.d.d = (Data *)local_b8;
      local_b8 = &pDVar6->super_QArrayData;
      pcStack_b0 = (char16_t *)local_78.d.ptr;
      local_78.d.ptr = (char *)pcVar3;
      local_78.d.size = (qsizetype)local_a8;
      local_a8 = (undefined1 *)qVar7;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,0x10);
        }
      }
      if (local_a8 != (undefined1 *)0x0) goto LAB_00624632;
    }
    else {
LAB_00624632:
      local_98.d = (Data *)0x0;
      local_98.ptr = (QString *)0x0;
      local_98.size = 0;
      QStandardPaths::findExecutable((QString *)&local_78,(QList_conflict *)&local_b8);
      pQVar2 = &((browser->d).d)->super_QArrayData;
      pcVar3 = (browser->d).ptr;
      (browser->d).d = (Data *)local_78.d.d;
      (browser->d).ptr = (char16_t *)local_78.d.ptr;
      puVar4 = (undefined1 *)(browser->d).size;
      (browser->d).size = local_78.d.size;
      local_78.d.d = (Data *)pQVar2;
      local_78.d.ptr = (char *)pcVar3;
      local_78.d.size = (qsizetype)puVar4;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,0x10);
        }
      }
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
      if ((browser->d).size != 0) {
        if (local_b8 != (QArrayData *)0x0) {
          LOCK();
          (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_b8,2,0x10);
          }
        }
        goto LAB_0062456a;
      }
    }
    if (local_b8 != (QArrayData *)0x0) {
      LOCK();
      (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_b8,2,0x10);
      }
    }
  }
  QByteArray::QByteArray(&local_78,"KDE",-1);
  if ((undefined1 *)(desktop->d).size == (undefined1 *)local_78.d.size) {
    if ((undefined1 *)local_78.d.size == (undefined1 *)0x0) {
      bVar13 = true;
    }
    else {
      iVar9 = bcmp((desktop->d).ptr,local_78.d.ptr,local_78.d.size);
      bVar13 = iVar9 == 0;
    }
  }
  else {
    bVar13 = false;
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (bVar13) {
    local_b8 = (QArrayData *)0x0;
    pcStack_b0 = L"kde-open5";
    local_a8 = (undefined1 *)0x9;
    local_98.size = 0;
    local_98.d = (Data *)0x0;
    local_98.ptr = (QString *)0x0;
    QStandardPaths::findExecutable((QString *)&local_78,(QList_conflict *)&local_b8);
    pQVar2 = &((browser->d).d)->super_QArrayData;
    pcVar3 = (browser->d).ptr;
    (browser->d).d = (Data *)local_78.d.d;
    (browser->d).ptr = (char16_t *)local_78.d.ptr;
    puVar4 = (undefined1 *)(browser->d).size;
    (browser->d).size = local_78.d.size;
    local_78.d.d = (Data *)pQVar2;
    local_78.d.ptr = (char *)pcVar3;
    local_78.d.size = (qsizetype)puVar4;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
    lVar5 = (browser->d).size;
    if (local_b8 != (QArrayData *)0x0) {
      LOCK();
      (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_b8,2,0x10);
      }
    }
    if (lVar5 != 0) goto LAB_0062456a;
    local_b8 = (QArrayData *)0x0;
    pcStack_b0 = L"kfmclient";
    local_a8 = (undefined1 *)0x9;
    local_98.size = 0;
    local_98.d = (Data *)0x0;
    local_98.ptr = (QString *)0x0;
    QStandardPaths::findExecutable((QString *)&local_78,(QList_conflict *)&local_b8);
    pQVar2 = &((browser->d).d)->super_QArrayData;
    pcVar3 = (browser->d).ptr;
    (browser->d).d = (Data *)local_78.d.d;
    (browser->d).ptr = (char16_t *)local_78.d.ptr;
    puVar4 = (undefined1 *)(browser->d).size;
    (browser->d).size = local_78.d.size;
    local_78.d.d = (Data *)pQVar2;
    local_78.d.ptr = (char *)pcVar3;
    local_78.d.size = (qsizetype)puVar4;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
    lVar5 = (browser->d).size;
    if (local_b8 != (QArrayData *)0x0) {
      LOCK();
      (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_b8,2,0x10);
      }
    }
    if (lVar5 != 0) {
      QVar14.m_data = &DAT_00000005;
      QVar14.m_size = (qsizetype)browser;
      QString::append(QVar14);
      goto LAB_0062456a;
    }
  }
  else {
    QByteArray::QByteArray(&local_78,"GNOME",-1);
    if ((undefined1 *)(desktop->d).size == (undefined1 *)local_78.d.size) {
      if ((undefined1 *)local_78.d.size == (undefined1 *)0x0) {
        bVar13 = true;
      }
      else {
        iVar9 = bcmp((desktop->d).ptr,local_78.d.ptr,local_78.d.size);
        bVar13 = iVar9 == 0;
      }
    }
    else {
      bVar13 = false;
    }
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (bVar13) {
      local_b8 = (QArrayData *)0x0;
      pcStack_b0 = L"gnome-open";
      local_a8 = (undefined1 *)0xa;
      local_98.size = 0;
      local_98.d = (Data *)0x0;
      local_98.ptr = (QString *)0x0;
      QStandardPaths::findExecutable((QString *)&local_78,(QList_conflict *)&local_b8);
      pQVar2 = &((browser->d).d)->super_QArrayData;
      pcVar3 = (browser->d).ptr;
      (browser->d).d = (Data *)local_78.d.d;
      (browser->d).ptr = (char16_t *)local_78.d.ptr;
      puVar4 = (undefined1 *)(browser->d).size;
      (browser->d).size = local_78.d.size;
      local_78.d.d = (Data *)pQVar2;
      local_78.d.ptr = (char *)pcVar3;
      local_78.d.size = (qsizetype)puVar4;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,0x10);
        }
      }
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
      lVar5 = (browser->d).size;
      if (local_b8 != (QArrayData *)0x0) {
        LOCK();
        (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_b8,2,0x10);
        }
      }
      if (lVar5 != 0) goto LAB_0062456a;
    }
  }
  uVar8 = 0;
  do {
    uVar10 = uVar8;
    if (local_58[uVar10] == (char *)0x0) {
      psVar11 = (storage_type *)0x0;
    }
    else {
      psVar11 = (storage_type *)0xffffffffffffffff;
      do {
        pcVar1 = psVar11 + (long)(local_58[uVar10] + 1);
        psVar11 = psVar11 + 1;
      } while (*pcVar1 != '\0');
    }
    QVar15.m_data = psVar11;
    QVar15.m_size = (qsizetype)&local_78;
    QString::fromLatin1(QVar15);
    local_b8 = &(local_78.d.d)->super_QArrayData;
    pcStack_b0 = (char16_t *)local_78.d.ptr;
    local_a8 = (undefined1 *)local_78.d.size;
    local_98.d = (Data *)0x0;
    local_98.ptr = (QString *)0x0;
    local_98.size = 0;
    QStandardPaths::findExecutable((QString *)&local_78,(QList_conflict *)&local_b8);
    pQVar2 = &((browser->d).d)->super_QArrayData;
    pcVar3 = (browser->d).ptr;
    (browser->d).d = (Data *)local_78.d.d;
    (browser->d).ptr = (char16_t *)local_78.d.ptr;
    puVar4 = (undefined1 *)(browser->d).size;
    (browser->d).size = local_78.d.size;
    local_78.d.d = (Data *)pQVar2;
    local_78.d.ptr = (char *)pcVar3;
    local_78.d.size = (qsizetype)puVar4;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
    lVar5 = (browser->d).size;
    if (local_b8 != (QArrayData *)0x0) {
      LOCK();
      (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_b8,2,0x10);
      }
    }
    if (lVar5 != 0) {
      bVar12 = true;
      goto LAB_0062456a;
    }
    uVar8 = uVar10 + 1;
  } while (uVar10 + 1 != 4);
  bVar12 = uVar10 < 3;
LAB_0062456a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar12;
}

Assistant:

static inline bool detectWebBrowser(const QByteArray &desktop,
                                    bool checkBrowserVariable,
                                    QString *browser)
{
    const char *browsers[] = {"google-chrome", "firefox", "mozilla", "opera"};

    browser->clear();
    if (checkExecutable(QStringLiteral("xdg-open"), browser))
        return true;

    if (checkBrowserVariable) {
        QString browserVariable = qEnvironmentVariable("DEFAULT_BROWSER");
        if (browserVariable.isEmpty())
            browserVariable = qEnvironmentVariable("BROWSER");
        if (!browserVariable.isEmpty() && checkExecutable(browserVariable, browser))
            return true;
    }

    if (desktop == QByteArray("KDE")) {
        if (checkExecutable(QStringLiteral("kde-open5"), browser))
            return true;
        // Konqueror launcher
        if (checkExecutable(QStringLiteral("kfmclient"), browser)) {
            browser->append(" exec"_L1);
            return true;
        }
    } else if (desktop == QByteArray("GNOME")) {
        if (checkExecutable(QStringLiteral("gnome-open"), browser))
            return true;
    }

    for (size_t i = 0; i < sizeof(browsers)/sizeof(char *); ++i)
        if (checkExecutable(QLatin1StringView(browsers[i]), browser))
            return true;
    return false;
}